

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  pointer pwVar1;
  size_type sVar2;
  size_type sVar3;
  int in_ECX;
  size_type sVar4;
  string local_48;
  
  pwVar1 = (wstr->_M_dataplus)._M_p;
  sVar2 = wstr->_M_string_length;
  sVar3 = 0;
  while (sVar4 = sVar3, sVar2 != sVar4) {
    if (pwVar1[sVar4] == L'\0') {
      local_48._M_dataplus._M_p._0_1_ = 0;
      operator<<(this,(char *)&local_48);
      sVar3 = sVar4 + 1;
    }
    else {
      internal::WideStringToUtf8_abi_cxx11_
                (&local_48,(internal *)(pwVar1 + sVar4),
                 (wchar_t *)(ulong)(uint)((int)sVar2 - (int)sVar4),in_ECX);
      operator<<(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      for (; (sVar3 = sVar2, sVar2 != sVar4 && (sVar3 = sVar4, pwVar1[sVar4] != L'\0'));
          sVar4 = sVar4 + 1) {
      }
    }
  }
  return this;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}